

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

uint32_t __thiscall Bitmap::getTextWidth(Bitmap *this,char *text)

{
  uint32_t local_28;
  uint32_t width;
  char character;
  char *text_local;
  Bitmap *this_local;
  
  if (this->font == (GFXfont *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    local_28 = 0;
    _width = text;
    while( true ) {
      if (*_width == '\0') break;
      GlyphIterator::init(this->glyphIterator,(EVP_PKEY_CTX *)this->font);
      local_28 = this->glyphIterator->xAdvance + local_28;
      _width = _width + 1;
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Bitmap::getTextWidth(const char * text) const
{
   char character;
   uint32_t width;

   if (this->font == nullptr)
   {
      return 0;
   }

   width = 0;
   while ((character = *text++) != 0)
   {
      //draw character
      glyphIterator->init(this->font, character);
      width += glyphIterator->xAdvance;
   }
   return width;
}